

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O3

double __thiscall spatial_region::get_max_w(spatial_region *this,double left,double right)

{
  celle *pcVar1;
  cellb *pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar7._0_4_ = (int)left;
  auVar7._4_4_ = (int)in_XMM0_Qb;
  auVar7._8_8_ = 0;
  auVar7 = vcvtdq2pd_avx(auVar7);
  dVar6 = 0.0;
  if (auVar7._0_8_ < right) {
    auVar8 = ZEXT1664(ZEXT816(0));
    lVar4 = (long)(int)left;
    do {
      if (0 < this->ny) {
        uVar5 = 0;
        do {
          if (0 < this->nz) {
            lVar3 = 0;
            pcVar1 = (this->ce).p._M_t.
                     super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                     super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar4][uVar5];
            pcVar2 = (this->cb).p._M_t.
                     super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                     super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar4][uVar5];
            do {
              dVar6 = *(double *)((long)&pcVar1->ey + lVar3);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)((long)&pcVar1->ex + lVar3);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)((long)&pcVar1->ez + lVar3);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = *(ulong *)((long)&pcVar2->bx + lVar3);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *(ulong *)((long)&pcVar2->by + lVar3);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = dVar6 * dVar6;
              auVar7 = vfmadd231sd_fma(auVar10,auVar9,auVar9);
              auVar7 = vfmadd213sd_fma(auVar14,auVar14,auVar7);
              auVar7 = vfmadd213sd_fma(auVar13,auVar13,auVar7);
              auVar7 = vfmadd231sd_fma(auVar7,auVar11,auVar11);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *(ulong *)((long)&pcVar2->bz + lVar3);
              lVar3 = lVar3 + 0x18;
              auVar7 = vfmadd213sd_fma(auVar12,auVar12,auVar7);
              auVar7 = vmaxsd_avx(auVar7,auVar8._0_16_);
              auVar8 = ZEXT1664(auVar7);
            } while ((ulong)(uint)this->nz * 0x18 != lVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)this->ny);
      }
      dVar6 = auVar8._0_8_;
      lVar4 = lVar4 + 1;
    } while ((double)(int)lVar4 < right);
  }
  return dVar6;
}

Assistant:

double spatial_region::get_max_w(double left, double right) {
    double max_w = 0.0;
    for (int i = left; i < right; i++) {
        for (int j = 0; j < ny; j++) {
            for (int k = 0; k < nz; k++) {
                celle & e = ce[i][j][k];
                cellb & b = cb[i][j][k];
                // fields are not interpolated to the same point, but should be fine for estimation
                double w = e.ex * e.ex + e.ey * e.ey + e.ez * e.ez + b.bx * b.bx + b.by * b.by + b.bz * b.bz;
                if (w > max_w) {
                    max_w = w;
                }
            }
        }
    }
    return max_w;
}